

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O0

void duckdb::ReservoirQuantileOperation::
     Operation<signed_char,duckdb::ReservoirQuantileState<signed_char>,duckdb::ReservoirQuantileScalarOperation>
               (ReservoirQuantileState<signed_char> *state,char *input,
               AggregateUnaryInput *unary_input)

{
  ReservoirQuantileBindData *this;
  BaseReservoirSampling *this_00;
  long in_RDI;
  ReservoirQuantileBindData *bind_data;
  undefined7 in_stack_ffffffffffffffd0;
  char in_stack_ffffffffffffffd7;
  idx_t in_stack_ffffffffffffffd8;
  
  optional_ptr<duckdb::FunctionData,_true>::operator->
            ((optional_ptr<duckdb::FunctionData,_true> *)
             CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
  this = FunctionData::Cast<duckdb::ReservoirQuantileBindData>
                   ((FunctionData *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
  if (*(long *)(in_RDI + 0x10) == 0) {
    ReservoirQuantileState<signed_char>::Resize
              ((ReservoirQuantileState<signed_char> *)unary_input,(idx_t)bind_data);
  }
  if (*(long *)(in_RDI + 0x18) == 0) {
    this_00 = (BaseReservoirSampling *)operator_new(0x78);
    duckdb::BaseReservoirSampling::BaseReservoirSampling(this_00);
    *(BaseReservoirSampling **)(in_RDI + 0x18) = this_00;
  }
  ReservoirQuantileState<signed_char>::FillReservoir
            ((ReservoirQuantileState<signed_char> *)this,in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd7);
  return;
}

Assistant:

static void Operation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &unary_input) {
		auto &bind_data = unary_input.input.bind_data->template Cast<ReservoirQuantileBindData>();
		if (state.pos == 0) {
			state.Resize(bind_data.sample_size);
		}
		if (!state.r_samp) {
			state.r_samp = new BaseReservoirSampling();
		}
		D_ASSERT(state.v);
		state.FillReservoir(bind_data.sample_size, input);
	}